

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4AddPair(Llb_Mgr_t_conflict *p,int iPart,int iVar)

{
  Llb_Var_t *pLVar1;
  Vec_Int_t *pVVar2;
  int iVar_local;
  int iPart_local;
  Llb_Mgr_t_conflict *p_local;
  
  if (p->pVars[iVar] == (Llb_Var_t *)0x0) {
    pLVar1 = (Llb_Var_t *)calloc(1,0x10);
    p->pVars[iVar] = pLVar1;
    p->pVars[iVar]->iVar = iVar;
    p->pVars[iVar]->nScore = 0;
    pVVar2 = Vec_IntAlloc(8);
    p->pVars[iVar]->vParts = pVVar2;
  }
  Vec_IntPush(p->pVars[iVar]->vParts,iPart);
  Vec_IntPush(p->pParts[iPart]->vVars,iVar);
  return;
}

Assistant:

void Llb_Nonlin4AddPair( Llb_Mgr_t * p, int iPart, int iVar )
{
    if ( p->pVars[iVar] == NULL )
    {
        p->pVars[iVar] = ABC_CALLOC( Llb_Var_t, 1 );
        p->pVars[iVar]->iVar   = iVar;
        p->pVars[iVar]->nScore = 0;
        p->pVars[iVar]->vParts = Vec_IntAlloc( 8 );
    }
    Vec_IntPush( p->pVars[iVar]->vParts, iPart );
    Vec_IntPush( p->pParts[iPart]->vVars, iVar );
}